

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.cc
# Opt level: O2

void __thiscall
tcmalloc::CentralFreeList::InsertRange(CentralFreeList *this,void *start,void *end,int N)

{
  int iVar1;
  bool bVar2;
  SpinLockHolder local_30;
  SpinLockHolder h;
  
  local_30.lock_ = &this->lock_;
  SpinLock::Lock(&this->lock_);
  if ((&DAT_0012e844)[(uint)this->size_class_] == N) {
    bVar2 = MakeCacheSpace(this);
    if (bVar2) {
      iVar1 = this->used_slots_;
      this->used_slots_ = iVar1 + 1;
      this->tc_slots_[iVar1].head = start;
      this->tc_slots_[iVar1].tail = end;
      goto LAB_00119153;
    }
  }
  ReleaseListToSpans(this,start);
LAB_00119153:
  SpinLockHolder::~SpinLockHolder(&local_30);
  return;
}

Assistant:

void CentralFreeList::InsertRange(void *start, void *end, int N) {
  SpinLockHolder h(&lock_);
  if (N == Static::sizemap()->num_objects_to_move(size_class_) &&
    MakeCacheSpace()) {
    int slot = used_slots_++;
    ASSERT(slot >=0);
    ASSERT(slot < max_cache_size_);
    TCEntry *entry = &tc_slots_[slot];
    entry->head = start;
    entry->tail = end;
    return;
  }
  ReleaseListToSpans(start);
}